

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

void __thiscall
crnlib::static_huffman_data_model::~static_huffman_data_model(static_huffman_data_model *this)

{
  decoder_tables *p;
  uint32 *puVar1;
  uint16 *puVar2;
  uchar *p_00;
  unsigned_short *p_01;
  
  p = this->m_pDecode_tables;
  if (p != (decoder_tables *)0x0) {
    puVar1 = p->m_lookup;
    if ((puVar1 != (uint32 *)0x0) && ((puVar1[-2] ^ puVar1[-1]) == 0xffffffff)) {
      crnlib_free(puVar1 + -4);
    }
    puVar2 = p->m_sorted_symbol_order;
    if ((puVar2 != (uint16 *)0x0) &&
       ((*(uint *)(puVar2 + -4) ^ *(uint *)(puVar2 + -2)) == 0xffffffff)) {
      crnlib_free(puVar2 + -8);
    }
    crnlib_free(p);
  }
  p_00 = (this->m_code_sizes).m_p;
  if (p_00 != (uchar *)0x0) {
    crnlib_free(p_00);
  }
  p_01 = (this->m_codes).m_p;
  if (p_01 != (unsigned_short *)0x0) {
    crnlib_free(p_01);
  }
  return;
}

Assistant:

static_huffman_data_model::~static_huffman_data_model()
    {
        if (m_pDecode_tables)
        {
            crnlib_delete(m_pDecode_tables);
        }
    }